

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  int iVar4;
  undefined4 extraout_var;
  char *in_RCX;
  char *pcVar5;
  undefined1 local_8428 [8];
  ElectricityBill bill;
  HttpServer server;
  EventLoop loop;
  InetAddress address;
  string log_path;
  code *local_50;
  code *local_48;
  ulong local_40;
  ulong local_38;
  
  address._32_8_ = &log_path._M_string_length;
  log_path._M_dataplus._M_p = (pointer)0x0;
  log_path._M_string_length._0_1_ = 0;
  local_40 = 0;
  local_38 = 0;
  while( true ) {
    while( true ) {
      iVar4 = getopt(argc,argv,"w:l:d");
      _Var3 = log_path._M_dataplus;
      pcVar5 = _optarg;
      sVar2 = web_root_abi_cxx11_._M_string_length;
      if (iVar4 < 0x77) break;
      if (iVar4 == 0x77) {
        strlen(_optarg);
        std::__cxx11::string::_M_replace(0x1313a8,0,(char *)sVar2,(ulong)pcVar5);
        in_RCX = pcVar5;
      }
    }
    if (iVar4 == -1) break;
    if (iVar4 == 100) {
      local_40 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
    }
    else if (iVar4 == 0x6c) {
      strlen(_optarg);
      local_38 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
      std::__cxx11::string::_M_replace((ulong)&address.port_,0,_Var3._M_p,(ulong)pcVar5);
      in_RCX = pcVar5;
    }
  }
  if ((local_40 & 1) != 0) {
    printf("daemon run");
    higan::System::DaemonRun();
  }
  if ((local_38 & 1) != 0) {
    local_8428 = (undefined1  [8])&bill.text_root_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8428,"df","");
    higan::Logger::SetLogToFile((string *)&address.port_,(string *)local_8428,false);
    if (local_8428 != (undefined1  [8])&bill.text_root_) {
      operator_delete((void *)local_8428,(ulong)(bill.text_root_._M_dataplus._M_p + 1));
    }
  }
  signal(0xd,(__sighandler_t)0x1);
  higan::EventLoop::EventLoop((EventLoop *)&server.on_http_request_._M_invoker);
  ElectricityBill::ElectricityBill
            ((ElectricityBill *)local_8428,(EventLoop *)&server.on_http_request_._M_invoker,
             &web_root_abi_cxx11_);
  g_bill = (ElectricityBill *)local_8428;
  higan::InetAddress::InetAddress((InetAddress *)&loop.timer_manager_.min_expire_time,4000);
  log_path.field_2._8_8_ = &local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&log_path.field_2 + 8),"ElectricityBill","");
  higan::HttpServer::HttpServer
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (EventLoop *)&server.on_http_request_._M_invoker,
             (InetAddress *)&loop.timer_manager_.min_expire_time,
             (string *)((long)&log_path.field_2 + 8));
  if ((code **)log_path.field_2._8_8_ != &local_50) {
    operator_delete((void *)log_path.field_2._8_8_,(ulong)(local_50 + 1));
  }
  log_path.field_2._8_8_ = OnHttpRequest;
  local_48 = std::
             _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&),_void_(*)(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&),_void_(*)(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&)>
             ::_M_manager;
  higan::HttpServer::SetHttpRequestCallback
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (HttpCallback *)((long)&log_path.field_2 + 8));
  if (local_50 != (code *)0x0) {
    puVar1 = (undefined1 *)((long)&log_path.field_2 + 8);
    (*local_50)(puVar1,puVar1,3);
  }
  higan::HttpServer::Start
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  higan::EventLoop::Loop((EventLoop *)&server.on_http_request_._M_invoker);
  higan::HttpServer::~HttpServer
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((size_type *)loop.timer_manager_.min_expire_time.microsecond_time_ !=
      &address.ip_._M_string_length) {
    operator_delete((void *)loop.timer_manager_.min_expire_time.microsecond_time_,
                    address.ip_._M_string_length + 1);
  }
  ElectricityBill::~ElectricityBill((ElectricityBill *)local_8428);
  higan::EventLoop::~EventLoop((EventLoop *)&server.on_http_request_._M_invoker);
  if ((size_type *)address._32_8_ != &log_path._M_string_length) {
    operator_delete((void *)address._32_8_,
                    CONCAT71(log_path._M_string_length._1_7_,(undefined1)log_path._M_string_length)
                    + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bool daemon = false;
	bool log_to_file = false;
	std::string log_path;

	int opt = -1;
	while ((opt = getopt(argc, argv, "w:l:d")) != -1)
	{
		switch (opt)
		{
			case 'w':
			{
				web_root = optarg;
				break;
			}
			case 'l':
			{
				log_to_file = true;
				log_path = optarg;
				break;
			}
			case 'd':
			{
				daemon = true;
				break;
			}
			default:
				break;
		}
	}

	if (daemon)
	{
		printf("daemon run");
		higan::System::DaemonRun();
	}
	if (log_to_file)
	{
		higan::Logger::SetLogToFile(log_path, "df", false);
	}

	signal(SIGPIPE, SIG_IGN);

	higan::EventLoop loop;

	ElectricityBill bill(&loop, web_root);
	g_bill = &bill;

	higan::InetAddress address{4000};

	higan::HttpServer server{&loop, address, "ElectricityBill"};
	server.SetHttpRequestCallback(OnHttpRequest);

	server.Start();
	loop.Loop();

	return 0;
}